

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_fixup_pass.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::ReplaceInternalInterpolate
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Op OVar5;
  FeatureManager *this;
  DefUseManager *this_00;
  Instruction *this_01;
  Instruction *this_02;
  uint32_t local_22c;
  uint32_t local_224;
  iterator local_220;
  undefined8 local_218;
  SmallVector<unsigned_int,_2UL> local_210;
  Operand local_1e8;
  uint32_t local_1b4;
  iterator local_1b0;
  undefined8 local_1a8;
  SmallVector<unsigned_int,_2UL> local_1a0;
  Operand local_178;
  uint32_t local_144;
  iterator local_140;
  undefined8 local_138;
  SmallVector<unsigned_int,_2UL> local_130;
  Operand local_108;
  uint32_t local_d4;
  iterator local_d0;
  undefined8 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  Operand local_98;
  undefined1 local_68 [8];
  OperandList new_operands;
  uint32_t op2_id;
  uint32_t ptr_id;
  Instruction *base_inst;
  Instruction *load_inst;
  uint32_t op1_id;
  uint32_t ext_opcode;
  uint32_t glsl450_ext_inst_id;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *ctx_local;
  
  this = IRContext::get_feature_mgr(ctx);
  uVar2 = FeatureManager::GetExtInstImportId_GLSLstd450(this);
  if (uVar2 == 0) {
    __assert_fail("glsl450_ext_inst_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interp_fixup_pass.cpp"
                  ,0x27,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceInternalInterpolate(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar3 = Instruction::GetSingleWordInOperand(inst,1);
  uVar4 = Instruction::GetSingleWordInOperand(inst,2);
  this_00 = IRContext::get_def_use_mgr(ctx);
  this_01 = analysis::DefUseManager::GetDef(this_00,uVar4);
  OVar5 = Instruction::opcode(this_01);
  if (OVar5 == OpLoad) {
    this_02 = Instruction::GetBaseAddress(this_01);
    OVar5 = Instruction::opcode(this_02);
    bVar1 = false;
    if (OVar5 == OpVariable) {
      uVar4 = Instruction::GetSingleWordInOperand(this_02,0);
      bVar1 = false;
      if (uVar4 == 1) {
        bVar1 = true;
      }
    }
    if (!bVar1) {
      __assert_fail("base_inst->opcode() == spv::Op::OpVariable && spv::StorageClass(base_inst->GetSingleWordInOperand( kSpvVariableStorageClassInIdx)) == spv::StorageClass::Input && \"unexpected interpolant in InterpolateAt*\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interp_fixup_pass.cpp"
                    ,0x34,
                    "bool spvtools::opt::(anonymous namespace)::ReplaceInternalInterpolate(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                   );
    }
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         Instruction::GetSingleWordInOperand(this_01,0);
    if (uVar3 == 0x4c) {
      local_22c = 0;
    }
    else {
      local_22c = Instruction::GetSingleWordInOperand(inst,3);
    }
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_22c;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_68);
    local_d0 = &local_d4;
    local_c8 = 1;
    init_list_02._M_len = 1;
    init_list_02._M_array = local_d0;
    local_d4 = uVar2;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,init_list_02);
    Operand::Operand(&local_98,SPV_OPERAND_TYPE_ID,&local_c0);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_68,
               &local_98);
    Operand::~Operand(&local_98);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c0);
    local_140 = &local_144;
    local_138 = 1;
    init_list_01._M_len = 1;
    init_list_01._M_array = local_140;
    local_144 = uVar3;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_130,init_list_01);
    Operand::Operand(&local_108,SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,&local_130);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_68,
               &local_108);
    Operand::~Operand(&local_108);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_130);
    local_1b4 = new_operands.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    local_1b0 = &local_1b4;
    local_1a8 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_1b0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1a0,init_list_00);
    Operand::Operand(&local_178,SPV_OPERAND_TYPE_ID,&local_1a0);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_68,
               &local_178);
    Operand::~Operand(&local_178);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1a0);
    if ((uint32_t)
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != 0) {
      local_224 = (uint32_t)
                  new_operands.
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_220 = &local_224;
      local_218 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_220;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_210,init_list);
      Operand::Operand(&local_1e8,SPV_OPERAND_TYPE_ID,&local_210);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_68
                 ,&local_1e8);
      Operand::~Operand(&local_1e8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_210);
    }
    Instruction::SetInOperands(inst,(OperandList *)local_68);
    IRContext::UpdateDefUse(ctx,inst);
    ctx_local._7_1_ = true;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_68);
  }
  else {
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

bool ReplaceInternalInterpolate(IRContext* ctx, Instruction* inst,
                                const std::vector<const analysis::Constant*>&) {
  uint32_t glsl450_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  assert(glsl450_ext_inst_id != 0);

  uint32_t ext_opcode = inst->GetSingleWordInOperand(1);

  uint32_t op1_id = inst->GetSingleWordInOperand(2);

  Instruction* load_inst = ctx->get_def_use_mgr()->GetDef(op1_id);
  if (load_inst->opcode() != spv::Op::OpLoad) return false;

  Instruction* base_inst = load_inst->GetBaseAddress();
  USE_ASSERT(base_inst->opcode() == spv::Op::OpVariable &&
             spv::StorageClass(base_inst->GetSingleWordInOperand(
                 kSpvVariableStorageClassInIdx)) == spv::StorageClass::Input &&
             "unexpected interpolant in InterpolateAt*");

  uint32_t ptr_id = load_inst->GetSingleWordInOperand(0);
  uint32_t op2_id = (ext_opcode != GLSLstd450InterpolateAtCentroid)
                        ? inst->GetSingleWordInOperand(3)
                        : 0;

  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {glsl450_ext_inst_id}});
  new_operands.push_back(
      {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {ext_opcode}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {ptr_id}});
  if (op2_id != 0) new_operands.push_back({SPV_OPERAND_TYPE_ID, {op2_id}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}